

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O2

void CECoordinates::Galactic2ICRS
               (double glon,double glat,double *ra,double *dec,CEAngleType *angle_type)

{
  if (*angle_type == DEGREES) {
    glon = glon * 0.017453292519943295;
    glat = glat * 0.017453292519943295;
  }
  iauG2icrs(glon,glat,ra,dec);
  if (*angle_type == DEGREES) {
    *ra = *ra * 57.29577951308232;
    *dec = *dec * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::Galactic2ICRS(double glon, double glat, 
                                  double *ra, double *dec,
                                  const CEAngleType& angle_type)
{
    // Check for degrees
    if (angle_type == CEAngleType::DEGREES) {
        glon *= DD2R ;
        glat *= DD2R ;
    }
    
    // Do the Galactic -> ICRS converstion
    iauG2icrs(glon, glat, ra, dec) ;
    
    // Now make sure to return the coordinates in the correct format
    if (angle_type == CEAngleType::DEGREES) {
        *ra  *= DR2D ;
        *dec *= DR2D ;
    }
}